

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O2

QVariant * __thiscall
QAssociativeConstIterator::key(QVariant *__return_storage_ptr__,QAssociativeConstIterator *this)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  QVariant *pQVar4;
  long in_FS_OFFSET;
  QMetaAssociation local_38;
  QMetaType local_30;
  QMetaType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.super_QMetaContainer.d_ptr =
       *(QMetaContainer *)
        (((this->super_QConstIterator<QMetaAssociation>).super_QBaseIterator<QMetaAssociation>.
          m_iterable.m_pointer.d & 0xfffffffffffffff8) + 0x10);
  local_28 = QMetaAssociation::keyMetaType(&local_38);
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant(__return_storage_ptr__,local_28,(void *)0x0);
  local_30.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QVariant>::metaType;
  bVar3 = ::comparesEqual(&local_28,&local_30);
  pQVar4 = __return_storage_ptr__;
  if (!bVar3) {
    pQVar4 = (QVariant *)::QVariant::data(__return_storage_ptr__);
  }
  lVar1 = *(long *)(((this->super_QConstIterator<QMetaAssociation>).
                     super_QBaseIterator<QMetaAssociation>.m_iterable.m_pointer.d &
                    0xfffffffffffffff8) + 0x10);
  if ((lVar1 != 0) && (pcVar2 = *(code **)(lVar1 + 200), pcVar2 != (code *)0x0)) {
    (*pcVar2)((this->super_QConstIterator<QMetaAssociation>).super_QBaseIterator<QMetaAssociation>.
              m_iterator,pQVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAssociativeConstIterator::key() const
{
    return QIterablePrivate::retrieveElement(
                metaContainer().keyMetaType(), [this](void *dataPtr) {
        metaContainer().keyAtConstIterator(constIterator(), dataPtr);
    });
}